

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O2

SQInteger debug_getlocals(HSQUIRRELVM v)

{
  int iVar1;
  SQInteger SVar2;
  SQChar *__s1;
  SQUnsignedInteger idx;
  SQBool includeInternal;
  SQInteger level;
  
  level = 1;
  includeInternal = 0;
  SVar2 = sq_gettop(v);
  if (1 < SVar2) {
    sq_getinteger(v,2,&level);
  }
  SVar2 = sq_gettop(v);
  if (2 < SVar2) {
    sq_getbool(v,3,&includeInternal);
  }
  sq_newtable(v);
  sq_gettop(v);
  idx = 0;
  do {
    __s1 = sq_getlocal(v,level,idx);
    if (__s1 == (SQChar *)0x0) {
      return 1;
    }
    if (includeInternal == 0) {
      if (*__s1 != '@') {
        iVar1 = strcmp(__s1,"this");
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"vargv");
          if (iVar1 != 0) goto LAB_0015f1f2;
        }
      }
    }
    else {
LAB_0015f1f2:
      sq_pushstring(v,__s1,-1);
      sq_push(v,-2);
      sq_newslot(v,-4,0);
    }
    sq_pop(v,1);
    idx = idx + 1;
  } while( true );
}

Assistant:

static SQInteger debug_getlocals(HSQUIRRELVM v)
{
    SQInteger level = 1;
    SQBool includeInternal = false;

    if (sq_gettop(v) >= 2)
        sq_getinteger(v, 2, &level);
    if (sq_gettop(v) >= 3)
        sq_getbool(v, 3, &includeInternal);

    sq_newtable(v);
    const SQChar *name = NULL;

    SQInteger seq=0;
    SQInteger prevTop = sq_gettop(v);
    while ((name = sq_getlocal(v, level, seq))) {
        ++seq;
        if (!includeInternal && (name[0] == '@' || strcmp(name, "this")==0 || strcmp(name, "vargv")==0)) {
            sq_pop(v, 1);
            continue;
        }

        sq_pushstring(v, name, -1);
        sq_push(v, -2);
        sq_newslot(v, -4, SQFalse);
        sq_pop(v, 1);
    }
    return 1;
}